

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overflow.h
# Opt level: O2

optional<long> CheckedAdd<long>(long i,long j)

{
  undefined8 in_RDX;
  undefined8 uVar1;
  long in_FS_OFFSET;
  optional<long> oVar2;
  
  if (i < 1) {
    if ((i != 0) && (j < -0x8000000000000000 - i)) goto LAB_003dce97;
  }
  else if (0x7fffffffffffffff - i < j) {
LAB_003dce97:
    uVar1 = 0;
    goto LAB_003dcea0;
  }
  j = j + i;
  uVar1 = CONCAT71((int7)((ulong)in_RDX >> 8),1);
LAB_003dcea0:
  if (*(long *)(in_FS_OFFSET + 0x28) != *(long *)(in_FS_OFFSET + 0x28)) {
    __stack_chk_fail();
  }
  oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._8_8_ =
       uVar1;
  oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = j;
  return (optional<long>)
         oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>;
}

Assistant:

[[nodiscard]] std::optional<T> CheckedAdd(const T i, const T j) noexcept
{
    if (AdditionOverflow(i, j)) {
        return std::nullopt;
    }
    return i + j;
}